

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

void Cba_ManPrintDistrib(Cba_Man_t *p)

{
  int *pUserCounts;
  long lVar1;
  int pCounts [90];
  int aiStack_188 [90];
  
  memset(aiStack_188,0,0x168);
  pUserCounts = (int *)calloc((long)(p->vNtks).nSize,4);
  Cba_ManCreatePrimMap(p->pTypeNames);
  if (1 < (p->vNtks).nSize) {
    lVar1 = 1;
    do {
      Cba_NtkCollectDistrib((Cba_Ntk_t *)(p->vNtks).pArray[lVar1],aiStack_188,pUserCounts);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (p->vNtks).nSize);
  }
  Cba_ManPrintDistribStat(p,aiStack_188,pUserCounts);
  if (pUserCounts != (int *)0x0) {
    free(pUserCounts);
    return;
  }
  return;
}

Assistant:

void Cba_ManPrintDistrib( Cba_Man_t * p )
{
    Cba_Ntk_t * pNtk; int i;
    int pCounts[CBA_BOX_LAST] = {0};
    int * pUserCounts = ABC_CALLOC( int, Cba_ManNtkNum(p) + 1 );
    Cba_ManCreatePrimMap( p->pTypeNames );
    Cba_ManForEachNtk( p, pNtk, i )
        Cba_NtkCollectDistrib( pNtk, pCounts, pUserCounts );
    Cba_ManPrintDistribStat( p, pCounts, pUserCounts );
    ABC_FREE( pUserCounts );
}